

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimax.hpp
# Opt level: O0

IMove __thiscall
generic_bots::MinimaxBot<ttt::Board,_minimax::ABeta<ttt::Board,_minimax::Eval<ttt::Board>_>_>::
MakeMove(MinimaxBot<ttt::Board,_minimax::ABeta<ttt::Board,_minimax::Eval<ttt::Board>_>_> *this)

{
  long lVar1;
  reference pvVar2;
  IMove *in_RDI;
  long move;
  int in_stack_0000011c;
  Board *in_stack_00000120;
  ABeta<ttt::Board,_minimax::Eval<ttt::Board>_> *in_stack_00000128;
  Board *in_stack_ffffffffffffffd0;
  vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_> local_28;
  long local_10;
  
  minimax::ABeta<ttt::Board,_minimax::Eval<ttt::Board>_>::operator()
            (in_stack_00000128,in_stack_00000120,in_stack_0000011c);
  pvVar2 = std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>::
           operator[](&local_28,0);
  lVar1 = pvVar2->first;
  std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>::~vector
            ((vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_> *)
             in_stack_ffffffffffffffd0);
  local_10 = lVar1;
  ttt::Board::ApplyMove(in_stack_ffffffffffffffd0,in_RDI);
  return local_10;
}

Assistant:

game::IMove MakeMove()
    {
        auto move = Minimax()(*this->game, depth)[0].first;
        this->game->ApplyMove(move);
        return move;
    }